

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::Config::collate(Config *this)

{
  Config *pCVar1;
  allocator<char> local_31;
  string local_30;
  Config *local_10;
  Config *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  pCVar1 = collate(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return pCVar1;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::collate()
{
    return collate("");
}